

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O0

Vec_Int_t * Supp_ManTransferEntry(Supp_One_t *p)

{
  Vec_Int_t *p_00;
  int local_1c;
  int i;
  Vec_Int_t *vSupp;
  Supp_One_t *p_local;
  
  p_00 = Vec_IntAlloc(p->nOuts);
  for (local_1c = 0; local_1c < p->nOuts; local_1c = local_1c + 1) {
    Vec_IntPush(p_00,(&p[1].nRefs)[local_1c]);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Supp_ManTransferEntry( Supp_One_t * p )
{
    Vec_Int_t * vSupp;
    int i;
    vSupp = Vec_IntAlloc( p->nOuts );
    for ( i = 0; i < p->nOuts; i++ )
        Vec_IntPush( vSupp, p->pOuts[i] );
    return vSupp;
}